

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

void __thiscall
(anonymous_namespace)::InfoWriter::
SetArray<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
          (InfoWriter *this,string *key,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *container)

{
  size_t sVar1;
  Value *this_00;
  Value *this_01;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  ArrayIndex index;
  Value local_50;
  
  this_00 = Json::Value::operator[]((Value *)this,key);
  Json::Value::Value(&local_50,arrayValue);
  Json::Value::operator=(this_00,&local_50);
  Json::Value::~Value(&local_50);
  sVar1 = (container->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 != 0) {
    Json::Value::resize(this_00,(ArrayIndex)sVar1);
    p_Var2 = (container->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(container->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      index = 0;
      do {
        Json::Value::Value(&local_50,(String *)(p_Var2 + 1));
        this_01 = Json::Value::operator[](this_00,index);
        index = index + 1;
        Json::Value::operator=(this_01,&local_50);
        Json::Value::~Value(&local_50);
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
  }
  return;
}

Assistant:

void InfoWriter::SetArray(std::string const& key, CONT const& container)
{
  MakeStringArray(this->Value_[key], container);
}